

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::
RepeatedImmutableStringFieldLiteGenerator
          (RepeatedImmutableStringFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  FieldGeneratorInfo *info;
  Context *context_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  RepeatedImmutableStringFieldLiteGenerator *this_local;
  
  ImmutableFieldLiteGenerator::ImmutableFieldLiteGenerator(&this->super_ImmutableFieldLiteGenerator)
  ;
  (this->super_ImmutableFieldLiteGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedImmutableStringFieldLiteGenerator_00efc548;
  this->descriptor_ = descriptor;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map(&this->variables_);
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  anon_unknown_7::SetPrimitiveVariables
            (descriptor,messageBitIndex,0,info,this->name_resolver_,&this->variables_,context);
  return;
}

Assistant:

RepeatedImmutableStringFieldLiteGenerator::
    RepeatedImmutableStringFieldLiteGenerator(const FieldDescriptor* descriptor,
                                              int messageBitIndex,
                                              Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  SetPrimitiveVariables(descriptor, messageBitIndex, 0,
                        context->GetFieldGeneratorInfo(descriptor),
                        name_resolver_, &variables_, context);
}